

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O1

void uo_cb_stack_push(uo_cb *cb,void *item)

{
  size_t sVar1;
  size_t sVar2;
  void **ppvVar3;
  
  sVar1 = (cb->stack).count;
  sVar2 = (cb->stack).capacity;
  (cb->stack).count = sVar1 + 1;
  if (sVar1 == sVar2) {
    (cb->stack).capacity = sVar2 * 2;
    ppvVar3 = (void **)realloc((cb->stack).items,sVar2 << 4);
    (cb->stack).items = ppvVar3;
  }
  (cb->stack).items[sVar1] = item;
  return;
}

Assistant:

inline void uo_cb_stack_push(
    uo_cb *cb,
    void *item)
{
    uo_stack_push(&cb->stack, item);
}